

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

Am_Object * __thiscall
Am_Object::Add_Part(Am_Object *this,Am_Slot_Key key,Am_Object *new_part,Am_Slot_Flags set_flags)

{
  uint *puVar1;
  unsigned_short *puVar2;
  Am_Object_Data *pAVar3;
  Am_Object_Data *pAVar4;
  Am_Part_Demon *pAVar5;
  Am_Wrapper *in_value;
  Am_Object in_value_00;
  Am_Constraint_Context *pAVar6;
  Am_Slot_Data *pAVar7;
  ostream *poVar8;
  Am_Object obj;
  Am_Object prev_part;
  Am_Value newval;
  Am_Slot_Data *new_slot;
  Am_Object in_stack_ffffffffffffff58;
  Am_Object *in_stack_ffffffffffffff60;
  Am_Object in_stack_ffffffffffffff68;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Value local_50;
  Am_Slot local_40;
  Am_Slot_Data *local_38;
  
  if (this->data != (Am_Object_Data *)0x0) {
    pAVar7 = Am_Object_Data::find_slot(this->data,key);
    local_88.data = (Am_Object_Data *)0x0;
    if ((pAVar7 != (Am_Slot_Data *)0x0) && ((pAVar7->super_Am_Value).type != 0x1002)) {
      if ((pAVar7->field_0x38 & 0x20) == 0) {
        if ((set_flags & 8) == 0) {
          puVar1 = &(pAVar7->context->super_Am_Wrapper).refs;
          *puVar1 = *puVar1 + 1;
          poVar8 = std::operator<<((ostream *)&std::cerr,
                                   "** Add_Part can only be called with slots that are not already in the object.  But Object "
                                  );
          Print((Am_Object *)&stack0xffffffffffffff68,poVar8);
          std::operator<<(poVar8," already has slot ");
          Am_Print_Key((ostream *)&std::cerr,pAVar7->key);
          std::operator<<((ostream *)&std::cerr,".\n");
          Am_Error((Am_Object *)&stack0xffffffffffffff68,pAVar7->key);
        }
      }
      else {
        if ((set_flags & 8) == 0) {
          slot_error("Add_Part called on part slot which is already there.  Use Set_Part instead",
                     pAVar7);
        }
        Get_Object((Am_Object *)&stack0xffffffffffffff68,(Am_Slot_Key)this,(ulong)key);
        operator=(&local_88,(Am_Object *)&stack0xffffffffffffff68);
        ~Am_Object((Am_Object *)&stack0xffffffffffffff68);
      }
    }
    pAVar3 = new_part->data;
    if ((pAVar3 != (Am_Object_Data *)0x0) && ((pAVar3->data).data != (char *)0x0)) {
      in_stack_ffffffffffffff60 = new_part;
      if ((pAVar3->owner_slot).super_Am_Value.value.wrapper_value != (Am_Wrapper *)0x0)
      goto LAB_001d485c;
      if (pAVar7 != (Am_Slot_Data *)0x0) {
        Remove_Slot(this,key);
      }
      puVar1 = &(pAVar3->super_Am_Wrapper).refs;
      *puVar1 = *puVar1 + 1;
      pAVar4 = this->data;
      (pAVar3->owner_slot).super_Am_Value.value.proc_value = (Am_Generic_Procedure *)pAVar4;
      pAVar7 = &pAVar3->part_slot;
      (pAVar3->part_slot).context = pAVar4;
      pAVar3->next_part = pAVar4->first_part;
      pAVar4->first_part = pAVar3;
      (pAVar3->part_slot).key = key;
      local_38 = pAVar7;
      DynArray::Add(&pAVar4->data,(char *)&local_38);
      puVar2 = &((this->data->demon_queue).data)->invoke_stack;
      *puVar2 = *puVar2 + 1;
      pAVar6 = cc;
      cc = Am_Empty_Constraint_Context;
      if (((short)this->data->demons_active < 0) &&
         (pAVar5 = this->data->demon_set->add_part_demon, pAVar5 != (Am_Part_Demon *)0x0)) {
        Am_Object(&local_58,this);
        Am_Object(&local_60,&Am_No_Object);
        Am_Object(&local_68,new_part);
        (*pAVar5)(in_stack_ffffffffffffff58,(Am_Object)new_part,in_stack_ffffffffffffff68);
        ~Am_Object(&local_68);
        ~Am_Object(&local_60);
        ~Am_Object(&local_58);
      }
      if (((short)pAVar3->demons_active < 0) &&
         (pAVar5 = pAVar3->demon_set->change_owner_demon, pAVar5 != (Am_Part_Demon *)0x0)) {
        Am_Object(&local_70,new_part);
        local_78.data = (Am_Object_Data *)0x0;
        Am_Object(&local_80,this);
        (*pAVar5)(in_stack_ffffffffffffff58,(Am_Object)new_part,in_stack_ffffffffffffff68);
        ~Am_Object(&local_80);
        ~Am_Object(&local_78);
        ~Am_Object(&local_70);
      }
      pAVar4 = this->data;
      puVar2 = &((pAVar4->demon_queue).data)->invoke_stack;
      cc = pAVar6;
      *puVar2 = *puVar2 - 1;
      puVar1 = &(pAVar4->super_Am_Wrapper).refs;
      *puVar1 = *puVar1 + 1;
      Am_Value::Am_Value((Am_Value *)&stack0xffffffffffffff68,(Am_Wrapper *)0x0);
      Am_Value::Am_Value(&local_50,&this->data->super_Am_Wrapper);
      local_40.data = pAVar7;
      am_CList::Change(&(pAVar3->owner_slot).dependencies,&local_40,(Am_Constraint *)0x0,
                       (Am_Value *)&stack0xffffffffffffff68,&local_50);
      in_value_00 = Am_No_Object;
      if (Am_No_Object.data != (Am_Object_Data *)0x0) {
        puVar1 = &((Am_No_Object.data)->super_Am_Wrapper).refs;
        *puVar1 = *puVar1 + 1;
      }
      Am_Value::operator=((Am_Value *)&stack0xffffffffffffff68,&(in_value_00.data)->super_Am_Wrapper
                         );
      in_value = (Am_Wrapper *)
                 (((Am_Object_Data *)new_part)->super_Am_Wrapper).super_Am_Registered_Type.
                 _vptr_Am_Registered_Type;
      if (in_value != (Am_Wrapper *)0x0) {
        in_value->refs = in_value->refs + 1;
      }
      Am_Value::operator=(&local_50,in_value);
      local_40.data = pAVar7;
      am_CList::Change(&(pAVar3->part_slot).dependencies,&local_40,(Am_Constraint *)0x0,
                       (Am_Value *)&stack0xffffffffffffff68,&local_50);
      if ((local_88.data != (Am_Object_Data *)0x0) && (((local_88.data)->data).data != (char *)0x0))
      {
        Destroy(&local_88);
      }
      Am_Value::~Am_Value(&local_50);
      Am_Value::~Am_Value((Am_Value *)&stack0xffffffffffffff68);
    }
    ~Am_Object(&local_88);
    return this;
  }
  slot_error("Add_Part called on a (0L) object",key);
LAB_001d485c:
  poVar8 = std::operator<<((ostream *)&std::cerr,"** Attempted to add object, ");
  Print(in_stack_ffffffffffffff60,poVar8);
  poVar8 = std::operator<<(poVar8,", to object, ");
  Print(this,poVar8);
  poVar8 = std::operator<<(poVar8,", when it already has owner, ");
  poVar8 = std::ostream::_M_insert<void_const*>(poVar8);
  poVar8 = std::operator<<(poVar8,".");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  Print(in_stack_ffffffffffffff60,poVar8);
  std::endl<char,std::char_traits<char>>(poVar8);
  Am_Error();
}

Assistant:

Am_Object &
Am_Object::Add_Part(Am_Slot_Key key, Am_Object new_part,
                    Am_Slot_Flags set_flags)
{
  if (!data)
    slot_error("Add_Part called on a (0L) object", key);
  Am_Slot_Data *slot = data->find_slot(key);
  Am_Object prev_part;
  if (slot && slot->type != Am_MISSING_SLOT) {
    if ((slot->flags & BIT_IS_PART)) {
      if (!(set_flags & Am_OK_IF_THERE)) {
        slot_error("Add_Part called on part slot which is already there.  "
                   "Use Set_Part instead",
                   slot);
        return Am_No_Object;
      }
      prev_part = Get_Object(key); //not very efficient, but safer
    } else {
      if (!(set_flags & Am_OK_IF_THERE)) {
        slot->context->Note_Reference();
        Am_Object obj = Am_Object(slot->context);
        std::cerr << "** Add_Part can only be called with slots that are not "
                     "already in the object.  But Object "
                  << obj << " already has slot ";
        Am_Print_Key(std::cerr, slot->key);
        std::cerr << ".\n";
        Am_Error(obj, slot->key);
        return Am_No_Object;
      }
    }
  }
  if (new_part.Valid()) {
    Am_Object_Data *added_part = new_part.data;
    Am_Object_Data *prev_owner =
        (Am_Object_Data *)added_part->owner_slot.value.wrapper_value;
    if (prev_owner) {
      std::cerr << "** Attempted to add object, " << new_part << ", to object, "
                << *this << ", when it already has owner, " << prev_owner << "."
                << std::endl;
      Am_ERROR(new_part);
    }
    if (slot)
      Remove_Slot(key); //if old slot exists, remove it

    added_part->Note_Reference();
    added_part->owner_slot.value.wrapper_value = data;
    added_part->part_slot.context = data;
    added_part->next_part = data->first_part;
    data->first_part = added_part;
    added_part->part_slot.key = key;
    Am_Slot_Data *new_slot = &(added_part->part_slot);
    data->data.Add((char *)&new_slot);
    data->demon_queue.Prevent_Invoke();
    Am_PUSH_EMPTY_CC() if ((data->demons_active & DEMONS_ACTIVE) &&
                           data->demon_set->add_part_demon)
        data->demon_set->add_part_demon(*this, Am_No_Object, new_part);
    if ((added_part->demons_active & DEMONS_ACTIVE) &&
        added_part->demon_set->change_owner_demon)
      added_part->demon_set->change_owner_demon(new_part, Am_Object(prev_owner),
                                                *this);
    Am_POP_EMPTY_CC() data->demon_queue.Release_Invoke();
    if (prev_owner)
      prev_owner->Note_Reference();
    data->Note_Reference();
    Am_Value oldval(prev_owner), newval(data);
    added_part->owner_slot.dependencies.Change(&added_part->part_slot, nullptr,
                                               oldval, newval);
    oldval = Am_No_Object;
    newval = new_part;
    added_part->part_slot.dependencies.Change(&added_part->part_slot, nullptr,
                                              oldval, newval);
    if (prev_part.Valid())
      prev_part.Destroy();
  }
  return *this;
}